

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmEndMacroCommand.cxx
# Opt level: O2

bool __thiscall
cmEndMacroCommand::InvokeInitialPass
          (cmEndMacroCommand *this,
          vector<cmListFileArgument,_std::allocator<cmListFileArgument>_> *param_1,
          cmExecutionStatus *param_2)

{
  allocator local_31;
  string local_30;
  
  std::__cxx11::string::string
            ((string *)&local_30,
             "An ENDMACRO command was found outside of a proper MACRO ENDMACRO structure. Or its arguments did not match the opening MACRO command."
             ,&local_31);
  cmCommand::SetError(&this->super_cmCommand,&local_30);
  std::__cxx11::string::~string((string *)&local_30);
  return false;
}

Assistant:

bool cmEndMacroCommand
::InvokeInitialPass(std::vector<cmListFileArgument> const&,
                    cmExecutionStatus &)
{
  this->SetError("An ENDMACRO command was found outside of a proper "
                 "MACRO ENDMACRO structure. Or its arguments did not "
                 "match the opening MACRO command.");
  return false;
}